

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O3

inetwork * create_network(void)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  network *this;
  EVP_PKEY_CTX *in_RSI;
  
  this = (network *)operator_new(0x48);
  (this->super_inetwork)._vptr_inetwork = (_func_int **)&PTR_update_0010cbe8;
  p_Var1 = &(this->objects_)._M_t._M_impl.super__Rb_tree_header;
  (this->objects_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->objects_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->objects_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->objects_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->objects_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->last_netid_ = 0;
  this->frame_ = (iframe *)0x0;
  iVar2 = network::init(this,in_RSI);
  if ((char)iVar2 == '\0') {
    (*(this->super_inetwork)._vptr_inetwork[6])(this);
    this = (network *)0x0;
  }
  return &this->super_inetwork;
}

Assistant:

inetwork* create_network()
{
    network* instance = new network();
    if (!instance->init())
    {
        instance->release();
        return NULL;
    }
    return instance;
}